

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O1

void light_free_file_info(light_pcapng_file_info *info)

{
  if (info->user_app_desc != (char *)0x0) {
    free(info->user_app_desc);
  }
  if (info->file_comment != (char *)0x0) {
    free(info->file_comment);
  }
  if (info->hardware_desc != (char *)0x0) {
    free(info->hardware_desc);
  }
  if (info->os_desc != (char *)0x0) {
    free(info->os_desc);
  }
  free(info);
  return;
}

Assistant:

void light_free_file_info(light_pcapng_file_info *info)
{
	if (info->user_app_desc != NULL)
		free(info->user_app_desc);

	if (info->file_comment != NULL)
		free(info->file_comment);

	if (info->hardware_desc != NULL)
		free(info->hardware_desc);

	if (info->os_desc != NULL)
		free(info->os_desc);

	free(info);
}